

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O3

void Saig_RefManFindReason_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Int_t *vPrios,Vec_Int_t *vReasons)

{
  Aig_Obj_t *pAVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  uint uVar6;
  Aig_Obj_t **ppAVar7;
  Aig_Obj_t *pAVar8;
  uint uVar9;
  Aig_Obj_t *pAVar10;
  
  iVar3 = p->nTravIds;
  if (pObj->TravId != iVar3) {
    do {
      pObj->TravId = iVar3;
      uVar2 = (uint)*(ulong *)&pObj->field_0x18;
      if ((uVar2 & 7) == 2) {
        Vec_IntPush(vReasons,(pObj->field_0).CioId);
        return;
      }
      if ((uVar2 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                      ,0x82,
                      "void Saig_RefManFindReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      pAVar1 = pObj->pFanin0;
      if ((*(ulong *)&pObj->field_0x18 & 8) == 0) {
        uVar2 = (uint)pAVar1 & 1;
        pAVar5 = (Aig_Obj_t *)((ulong)pAVar1 & 0xfffffffffffffffe);
        uVar6 = *(uint *)&pAVar5->field_0x18 >> 3 & 1;
        pAVar8 = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
        uVar9 = (*(uint *)&pAVar8->field_0x18 >> 3 ^ (uint)pObj->pFanin1) & 1;
        if ((uVar2 != uVar6) && (uVar9 != 0)) {
          __assert_fail("!fPhase0 || !fPhase1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                        ,0x8c,
                        "void Saig_RefManFindReason_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        if (((uVar2 != uVar6) || (pAVar10 = pAVar5, uVar9 == 0)) &&
           ((uVar2 == uVar6 || (pAVar10 = pAVar8, uVar9 != 0)))) {
          iVar4 = -1;
          iVar3 = -1;
          if (pAVar1 != (Aig_Obj_t *)0x0) {
            iVar3 = pAVar5->Id;
          }
          ppAVar7 = &pObj->pFanin1;
          iVar3 = Vec_IntEntry(vPrios,iVar3);
          if (*ppAVar7 != (Aig_Obj_t *)0x0) {
            iVar4 = *(int *)(((ulong)*ppAVar7 & 0xfffffffffffffffe) + 0x24);
          }
          iVar4 = Vec_IntEntry(vPrios,iVar4);
          if (iVar3 <= iVar4) {
            ppAVar7 = &pObj->pFanin0;
          }
          goto LAB_0059519a;
        }
      }
      else {
        Saig_RefManFindReason_rec
                  (p,(Aig_Obj_t *)((ulong)pAVar1 & 0xfffffffffffffffe),vPrios,vReasons);
        ppAVar7 = &pObj->pFanin1;
LAB_0059519a:
        pAVar10 = (Aig_Obj_t *)((ulong)*ppAVar7 & 0xfffffffffffffffe);
      }
      iVar3 = p->nTravIds;
      pObj = pAVar10;
    } while (pAVar10->TravId != iVar3);
  }
  return;
}

Assistant:

void Saig_RefManFindReason_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Int_t * vPrios, Vec_Int_t * vReasons )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_IntPush( vReasons, Aig_ObjCioId(pObj) );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    if ( pObj->fPhase )
    {
        Saig_RefManFindReason_rec( p, Aig_ObjFanin0(pObj), vPrios, vReasons );
        Saig_RefManFindReason_rec( p, Aig_ObjFanin1(pObj), vPrios, vReasons );
    }
    else
    {
        int fPhase0 = Aig_ObjFaninC0(pObj) ^ Aig_ObjFanin0(pObj)->fPhase;
        int fPhase1 = Aig_ObjFaninC1(pObj) ^ Aig_ObjFanin1(pObj)->fPhase;
        assert( !fPhase0 || !fPhase1 );
        if ( !fPhase0 && fPhase1 )
            Saig_RefManFindReason_rec( p, Aig_ObjFanin0(pObj), vPrios, vReasons );
        else if ( fPhase0 && !fPhase1 )
            Saig_RefManFindReason_rec( p, Aig_ObjFanin1(pObj), vPrios, vReasons );
        else 
        {
            int iPrio0 = Vec_IntEntry( vPrios, Aig_ObjFaninId0(pObj) );
            int iPrio1 = Vec_IntEntry( vPrios, Aig_ObjFaninId1(pObj) );
            if ( iPrio0 <= iPrio1 )
                Saig_RefManFindReason_rec( p, Aig_ObjFanin0(pObj), vPrios, vReasons );
            else
                Saig_RefManFindReason_rec( p, Aig_ObjFanin1(pObj), vPrios, vReasons );
        }
    }
}